

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O2

MPP_RET mpp_opt_parse(MppOpt opt,int argc,char **argv)

{
  char *pcVar1;
  code *pcVar2;
  int iVar3;
  MPP_RET MVar4;
  MPP_RET MVar5;
  long lVar6;
  MppOptImpl *impl;
  undefined8 in_R9;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  
  MVar4 = MPP_NOK;
  MVar5 = MPP_NOK;
  if ((((opt != (MppOpt)0x0) && (uVar9 = 0xffffffffffffffff, MVar5 = MVar4, argv != (char **)0x0))
      && (1 < argc)) && (*(long *)((long)opt + 8) != 0)) {
    iVar3 = 0;
    while (iVar3 <= argc) {
      iVar7 = iVar3 + 1;
      if (iVar7 < argc) {
        pcVar8 = argv[iVar7];
      }
      else {
        pcVar8 = (char *)0x0;
      }
      pcVar1 = argv[iVar3];
      if (pcVar1 == (char *)0x0) break;
      iVar3 = iVar7;
      if ((*pcVar1 == '-') && (pcVar1[1] != '\0')) {
        lVar6 = mpp_trie_get_info(*(undefined8 *)((long)opt + 8),pcVar1 + 1);
        if (lVar6 == 0) {
          _mpp_log_l(2,"mpp_opt","invalid option %s\n",0,pcVar1 + 1,in_R9,uVar9);
        }
        else {
          pcVar2 = *(code **)(lVar6 + 0x1c + (ulong)*(byte *)(lVar6 + 3));
          if (pcVar2 == (code *)0x0) {
            MVar4 = MPP_OK;
          }
          else {
            MVar4 = (*pcVar2)(*opt,pcVar8);
            if (MVar4 < MPP_OK) {
              return MVar4;
            }
          }
          iVar3 = MVar4 + iVar7;
        }
      }
    }
    MVar5 = MPP_OK;
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_opt_parse(MppOpt opt, int argc, char **argv)
{
    MppOptImpl *impl = (MppOptImpl *)opt;
    MPP_RET ret = MPP_NOK;
    RK_S32 opt_idx = 0;

    if (NULL == impl || NULL == impl->trie || argc < 2 || NULL == argv)
        return ret;

    ret = MPP_OK;

    while (opt_idx <= argc) {
        RK_S32 opt_next = opt_idx + 1;
        char *opts = argv[opt_idx++];
        char *next = (opt_next >= argc) ? NULL : argv[opt_next];

        if (NULL == opts)
            break;

        if (opts[0] == '-' && opts[1] != '\0') {
            MppOptInfo *info = NULL;
            MppTrieInfo *node = mpp_trie_get_info(impl->trie, opts + 1);
            RK_S32 step = 0;

            if (NULL == node) {
                mpp_err("invalid option %s\n", opts + 1);
                continue;
            }

            info = mpp_trie_info_ctx(node);
            if (info->proc)
                step = info->proc(impl->ctx, next);

            /* option failure or help */
            if (step < 0) {
                ret = step;
                break;
            }

            opt_idx += step;
        }
    }

    return ret;
}